

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  int *piVar4;
  xmlGenericErrorFunc p_Var5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr obj;
  xmlLocationSetPtr val;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlDocPtr pxVar9;
  int i;
  int iVar10;
  int startindex;
  xmlDocPtr cur;
  long lVar11;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iStack_40 = 0xc;
    goto LAB_001e0b8f;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_40 = 0x17;
    goto LAB_001e0b8f;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iStack_40 = 0xb;
    goto LAB_001e0b8f;
  }
  pxVar6 = valuePop(ctxt);
  obj = pxVar6;
  if (pxVar6->type == XPATH_NODESET) {
    obj = xmlXPtrNewLocationSetNodeSet(pxVar6->nodesetval);
    xmlXPathFreeObject(pxVar6);
    if (obj != (xmlXPathObjectPtr)0x0) goto LAB_001e0a11;
  }
  else {
LAB_001e0a11:
    piVar3 = (int *)obj->user;
    val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
    if (val != (xmlLocationSetPtr)0x0) {
      if (piVar3 != (int *)0x0) {
        for (lVar11 = 0; lVar11 < *piVar3; lVar11 = lVar11 + 1) {
          piVar4 = *(int **)(*(long *)(piVar3 + 2) + lVar11 * 8);
          if (((piVar4 == (int *)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) ||
             (pxVar9 = ctxt->context->doc, pxVar9 == (xmlDocPtr)0x0)) {
LAB_001e0abf:
            pxVar6 = (xmlXPathObjectPtr)0x0;
          }
          else {
            if (*piVar4 == 6) {
              cur = *(xmlDocPtr *)(piVar4 + 10);
              if (*(xmlDocPtr *)(piVar4 + 0xe) == (xmlDocPtr)0x0) {
                if (cur != pxVar9) {
                  xVar2 = cur->type;
                  if (XML_HTML_DOCUMENT_NODE < xVar2) goto LAB_001e0abf;
                  if ((0x33baU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
                    iVar10 = 1;
                    for (pxVar9 = cur; pxVar9 != (xmlDocPtr)0x0; pxVar9 = (xmlDocPtr)pxVar9->prev) {
                      if ((pxVar9->type < XML_DTD_NODE) &&
                         ((0x2202U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) !=
                          0)) {
                        iVar10 = iVar10 + 1;
                      }
                    }
                    cur = (xmlDocPtr)cur->parent;
                    startindex = iVar10 + -1;
                    iVar10 = iVar10 + 1;
                    pxVar9 = cur;
                    goto LAB_001e0b37;
                  }
                  pxVar6 = (xmlXPathObjectPtr)0x0;
                  if (xVar2 == XML_ATTRIBUTE_NODE) goto LAB_001e0b25;
                  goto LAB_001e0ac1;
                }
LAB_001e0b25:
                iVar10 = xmlXPtrGetArity((xmlNodePtr)cur);
                startindex = 0;
                pxVar9 = cur;
              }
              else {
                startindex = piVar4[0xc];
                iVar10 = piVar4[0x10];
                pxVar9 = *(xmlDocPtr *)(piVar4 + 0xe);
              }
            }
            else {
              if (*piVar4 != 5) {
                pp_Var7 = __xmlGenericError();
                p_Var5 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var5)(*ppvVar8,"Unimplemented block at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
                          ,0x7d5);
                goto LAB_001e0abf;
              }
              cur = *(xmlDocPtr *)(piVar4 + 10);
              iVar10 = piVar4[0xc];
              pxVar9 = cur;
              startindex = iVar10;
            }
LAB_001e0b37:
            pxVar6 = xmlXPtrNewRange((xmlNodePtr)cur,startindex,(xmlNodePtr)pxVar9,iVar10);
          }
LAB_001e0ac1:
          xmlXPtrLocationSetAdd(val,pxVar6);
        }
      }
      pxVar6 = xmlXPtrWrapLocationSet(val);
      valuePush(ctxt,pxVar6);
      xmlXPathFreeObject(obj);
      return;
    }
    xmlXPathFreeObject(obj);
  }
  iStack_40 = 0xf;
LAB_001e0b8f:
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

static void
xmlXPtrRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i;
    xmlXPathObjectPtr set;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    set = valuePop(ctxt);
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to compute the covering range for each item and add it
     */
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(set);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    if (oldset != NULL) {
        for (i = 0;i < oldset->locNr;i++) {
            xmlXPtrLocationSetAdd(newset,
                    xmlXPtrCoveringRange(ctxt, oldset->locTab[i]));
        }
    }

    /*
     * Save the new value and cleanup
     */
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
}